

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsIterationResult
helicsFederateEnterExecutingModeIterative
          (HelicsFederate fed,HelicsIterationRequest iterate,HelicsError *err)

{
  Federate *this;
  IterationRequest iterate_00;
  IterationResult IVar1;
  FedObject *pFVar2;
  HelicsIterationResult HVar3;
  
  pFVar2 = helics::getFedObject(fed,err);
  HVar3 = HELICS_ITERATION_RESULT_ERROR;
  if ((pFVar2 != (FedObject *)0x0) &&
     (this = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    iterate_00 = (IterationRequest)(0x700030000020100 >> ((char)iterate * '\b' & 0x3fU));
    if (HELICS_ITERATION_REQUEST_ERROR < iterate) {
      iterate_00 = NO_ITERATIONS;
    }
    IVar1 = helics::Federate::enterExecutingMode(this,iterate_00);
    if (IVar1 < 4) {
      HVar3 = *(HelicsIterationResult *)(&DAT_004296d0 + (ulong)IVar1 * 4);
    }
  }
  return HVar3;
}

Assistant:

HelicsIterationResult helicsFederateEnterExecutingModeIterative(HelicsFederate fed, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_ITERATION_RESULT_ERROR;
    }
    try {
        auto val = fedObj->enterExecutingMode(getIterationRequest(iterate));
        return getIterationStatus(val);
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_ITERATION_RESULT_ERROR;
    }
}